

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyDropEmptyElements(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *pNVar2;
  
  if (node != (Node *)0x0) {
    do {
      pNVar2 = node->next;
      if (node->content != (Node *)0x0) {
        prvTidyDropEmptyElements(doc,node->content);
      }
      BVar1 = prvTidynodeIsElement(node);
      if ((BVar1 != no) ||
         ((BVar1 = prvTidynodeIsText(node), BVar1 != no && (node->end <= node->start)))) {
        pNVar2 = prvTidyTrimEmptyElement(doc,node);
      }
      node = pNVar2;
    } while (node != (Node *)0x0);
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(DropEmptyElements)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->content)
            TY_(DropEmptyElements)(doc, node->content);

        if (!TY_(nodeIsElement)(node) &&
            !(TY_(nodeIsText)(node) && !(node->start < node->end)))
        {
            node = next;
            continue;
        }

        next = TY_(TrimEmptyElement)(doc, node);
        node = next;
    }

    return node;
}